

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<std::pair<QString,QString>,QString>>::
findBucketWithHash<std::pair<QString,QString>>
          (Data<QHashPrivate::Node<std::pair<QString,QString>,QString>> *this,
          pair<QString,_QString> *key,size_t hash)

{
  bool bVar1;
  ulong uVar2;
  Span *pSVar3;
  Span *pSVar4;
  Bucket BVar5;
  
  uVar2 = *(long *)(this + 0x10) - 1U & hash;
  pSVar3 = (Span *)((uVar2 >> 7) * 0x90 + *(long *)(this + 0x20));
  uVar2 = (ulong)((uint)uVar2 & 0x7f);
  do {
    if (pSVar3->offsets[uVar2] == 0xff) {
LAB_00287995:
      bVar1 = false;
    }
    else {
      bVar1 = qHashEquals<std::pair<QString,QString>>
                        ((pair<QString,_QString> *)
                         ((pSVar3->entries->storage).data + (uint)pSVar3->offsets[uVar2] * 0x48),key
                        );
      if (bVar1) goto LAB_00287995;
      uVar2 = uVar2 + 1;
      bVar1 = true;
      if (uVar2 == 0x80) {
        pSVar4 = pSVar3 + 1;
        pSVar3 = *(Span **)(this + 0x20);
        if (((long)pSVar4 - (long)*(Span **)(this + 0x20) >> 4) * -0x71c71c71c71c71c7 -
            (*(ulong *)(this + 0x10) >> 7) != 0) {
          pSVar3 = pSVar4;
        }
        uVar2 = 0;
      }
    }
    if (!bVar1) {
      BVar5.index = uVar2;
      BVar5.span = pSVar3;
      return BVar5;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }